

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.c
# Opt level: O3

int Instructions(int loc)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  OpTab *pOVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  char cVar15;
  int iVar16;
  uint uVar17;
  char cVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar5 = _DAT_0010df00;
  auVar4 = _DAT_0010def0;
  auVar3 = _DAT_0010dee0;
  if (optabsize == 0) {
    pOVar8 = MnemTab;
    uVar7 = 0;
    do {
      pOVar8 = pOVar8 + 1;
      uVar7 = uVar7 + 1;
    } while (pOVar8->Mnem[0] != '\0');
    oplimits[0] = 0;
    uVar9 = 0;
    uVar17 = 0;
    optabsize = uVar7;
    oplimits[0x1a] = uVar7;
    do {
      iVar16 = (int)MnemTab[uVar9].Mnem[0];
      uVar1 = iVar16 - 0x40;
      if (uVar1 != uVar17 && 0x40 < iVar16) {
        uVar2 = uVar17 + 1;
        iVar14 = (int)uVar9;
        uVar6 = uVar2;
        if ((int)uVar2 < (int)uVar1) {
          uVar17 = (iVar16 - uVar17) - 0x42;
          auVar20._4_4_ = 0;
          auVar20._0_4_ = uVar17;
          auVar20._8_4_ = uVar17;
          auVar20._12_4_ = 0;
          lVar12 = (long)(int)uVar2 * 4;
          auVar20 = auVar20 ^ auVar5;
          uVar19 = 0;
          do {
            auVar21._8_4_ = (int)uVar19;
            auVar21._0_8_ = uVar19;
            auVar21._12_4_ = (int)(uVar19 >> 0x20);
            auVar23 = (auVar21 | auVar4) ^ auVar5;
            iVar16 = auVar20._4_4_;
            if ((bool)(~(iVar16 < auVar23._4_4_ ||
                        auVar20._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar16) & 1)) {
              oplimits[(long)(int)uVar2 + uVar19] = iVar14;
            }
            if (auVar23._12_4_ <= auVar20._12_4_ &&
                (auVar23._8_4_ <= auVar20._8_4_ || auVar23._12_4_ != auVar20._12_4_)) {
              *(int *)(lVar12 + 0x113644 + uVar19 * 4) = iVar14;
            }
            auVar21 = (auVar21 | auVar3) ^ auVar5;
            iVar13 = auVar21._4_4_;
            if (iVar13 <= iVar16 && (iVar13 != iVar16 || auVar21._0_4_ <= auVar20._0_4_)) {
              *(int *)(lVar12 + 0x113648 + uVar19 * 4) = iVar14;
              *(int *)(lVar12 + 0x11364c + uVar19 * 4) = iVar14;
            }
            uVar19 = uVar19 + 4;
            uVar6 = uVar1;
          } while (((ulong)uVar17 + 4 & 0xfffffffffffffffc) != uVar19);
        }
        uVar17 = uVar6;
        oplimits[uVar17] = iVar14;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
    if ((int)uVar17 < 0x19) {
      lVar10 = (long)(int)uVar17;
      lVar12 = 0x18 - lVar10;
      auVar23._8_4_ = (int)lVar12;
      auVar23._0_8_ = lVar12;
      auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
      lVar12 = lVar10 * 4;
      uVar9 = 0;
      auVar23 = auVar23 ^ auVar5;
      do {
        auVar22._8_4_ = (int)uVar9;
        auVar22._0_8_ = uVar9;
        auVar22._12_4_ = (int)(uVar9 >> 0x20);
        auVar20 = (auVar22 | auVar4) ^ auVar5;
        iVar16 = auVar23._4_4_;
        if ((bool)(~(auVar20._4_4_ == iVar16 && auVar23._0_4_ < auVar20._0_4_ ||
                    iVar16 < auVar20._4_4_) & 1)) {
          *(uint *)(lVar12 + 0x113644 + uVar9 * 4) = uVar7;
        }
        if ((auVar20._12_4_ != auVar23._12_4_ || auVar20._8_4_ <= auVar23._8_4_) &&
            auVar20._12_4_ <= auVar23._12_4_) {
          *(uint *)(lVar12 + 0x113648 + uVar9 * 4) = uVar7;
        }
        auVar20 = (auVar22 | auVar3) ^ auVar5;
        iVar14 = auVar20._4_4_;
        if (iVar14 <= iVar16 && (iVar14 != iVar16 || auVar20._0_4_ <= auVar23._0_4_)) {
          *(uint *)(lVar12 + 0x11364c + uVar9 * 4) = uVar7;
          *(uint *)(lVar12 + 0x113650 + uVar9 * 4) = uVar7;
        }
        uVar9 = uVar9 + 4;
      } while ((0x1cU - lVar10 & 0xfffffffffffffffc) != uVar9);
    }
  }
  iVar16 = (int)OpCode[0];
  if (iVar16 < 0x40) {
    iVar14 = 0;
    piVar11 = oplimits + 1;
  }
  else {
    if (0x5a < (byte)OpCode[0]) {
      Dir = 0;
      AdrModeA = 0;
      AdrModeB = 0;
      Op = 0;
      return 0;
    }
    iVar14 = oplimits[iVar16 - 0x40];
    piVar11 = oplimits + (iVar16 - 0x3f);
  }
  iVar16 = *piVar11;
  if (iVar14 < iVar16) {
    do {
      iVar13 = (iVar16 + iVar14) / 2;
      cVar15 = MnemTab[iVar13].Mnem[0];
      cVar18 = OpCode[0];
      if ((OpCode[0] != '\0') && (OpCode[0] == cVar15)) {
        lVar12 = 1;
        do {
          cVar18 = OpCode[lVar12];
          cVar15 = MnemTab[iVar13].Mnem[lVar12];
          if (cVar18 == '\0') break;
          lVar12 = lVar12 + 1;
        } while (cVar18 == cVar15);
      }
      if (cVar15 <= cVar18) {
        if (cVar18 <= cVar15) {
          AdrModeA = MnemTab[iVar13].AMA;
          if (AdrModeA == 0xffff) {
            AdrModeB = 0;
            AdrModeA = 0;
            Op = 0;
            Dir = MnemTab[iVar13].AMB;
          }
          else {
            Op = MnemTab[iVar13].OpBits;
            AdrModeB = MnemTab[iVar13].AMB;
            Dir = 0;
          }
          return 1;
        }
        iVar14 = iVar13 + 1;
        iVar13 = iVar16;
      }
      iVar16 = iVar13;
    } while (iVar14 < iVar16);
  }
  Op = 0;
  AdrModeB = 0;
  AdrModeA = 0;
  Dir = 0;
  return 0;
}

Assistant:

int Instructions(int loc)
/* Looks up opcode and addressing mode bit patterns
 If the opcode corresponds to an executable instruction,
 returns TRUE with the following fields set up:
 Op       - operation code bits
 AdrModeA - addressing mode bits
 AdrModeB - more addressing mode bits
 Dir      - None
 If the opcode corresponds to a directive (AdrModeA in the table
 is 0xFFFF), returns TRUE with the following fields set up:
 Op       - 0
 AdrModeA - 0
 AdrModeB - 0
 Dir      - the appropriate directive value
 If not found, returns FALSE with all the above fields set to zero.

 NOTE: The binary search doesn't use strcmp because this function
 returns incorrect values under MS-DOS Lattice 2.12.		      */
{

// For the love of god. strcmp is slower than C implementation. -- Alkis
//#define USESTRCMP
#ifdef USESTRCMP
	register int cmp;
#else
	register char *i, *j;
#endif
	register int lower, upper, mid; /* Binary search controls */

	if (optabsize == 0) { /* Determine size of opcode table. */
		while (MnemTab[optabsize].Mnem[0])
			optabsize++;
		oplimits[0] = 0;
		oplimits['Z' - 'A' + 1] = optabsize;
		mid = 0;
		for (lower = 0; lower < optabsize; lower++) {
			upper = (unsigned int) MnemTab[lower].Mnem[0] - 'A' + 1;
			if (upper != mid) {
				if (upper > 0) { /* Start of the next letter */
					mid++;
					while (mid < upper)
						oplimits[mid++] = lower;
					oplimits[mid] = lower;
				}
			}
		}
		mid++;
		while (mid < 'Z' - 'A' + 1) {
			oplimits[mid++] = optabsize; /* In case we didn't get to Z */
		}
	}

	mid = (unsigned int) OpCode[0] - 'A' + 1;
	if (mid < 0) { /* This catches stuff like "=". */
		lower = 0;
		upper = oplimits[1];
	} else if (mid > 'Z' - 'A' + 1) {
		lower = upper = 0; /* Reject this one. */
	} else {
		lower = oplimits[mid++];
		upper = oplimits[mid];
	}
	while (lower < upper) {
		mid = (lower + upper) / 2; /* Search the opcode table. */
#ifdef USESTRCMP
		cmp = strcmp(OpCode,MnemTab[mid].Mnem);
		if (cmp<0) {
			upper = mid; /* Search lower half of table. */
		} else if (cmp>0) {
			lower = mid + 1; /* Search upper half of table. */
#else
		for (i = OpCode, j = MnemTab[mid].Mnem; *i == *j; i++, j++)
			if (*i == '\0')
				break; /* Find the first non-match. */
		if (*i < *j) {
			upper = mid; /* Search lower half of table. */
		} else if (*i > *j) {
			lower = mid + 1; /* Search upper half of table. */
#endif
		}else if (MnemTab[mid].AMA != 0xFFFF) { /* Found it. */
			Op = MnemTab[mid].OpBits; /* Executable instruction */
			AdrModeA = MnemTab[mid].AMA;
			AdrModeB = MnemTab[mid].AMB;
			Dir = None;
			return (TRUE);
		} else {
			Op = AdrModeA = AdrModeB = 0; /* Directive */
			Dir = MnemTab[mid].AMB;
			return (TRUE);
		}
	}
	Op = AdrModeA = AdrModeB = Dir = 0;
	return (FALSE); /* We didn't find it. */
}